

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

char * CVmObjBigNum::cache_ln2(size_t prec)

{
  ushort *dst;
  CVmBigNumCache *pCVar1;
  int iVar2;
  uint16_t tmp;
  ulong uVar3;
  
  pCVar1 = S_bignum_cache;
  iVar2 = CVmBigNumCacheReg::alloc_mem(&S_bignum_cache->ln2_,(prec + 7 >> 3) * 4 + 5);
  dst = (ushort *)(pCVar1->ln2_).buf_;
  if (dst != (ushort *)0x0) {
    uVar3 = prec + 7 & 0xfffffffffffffff8;
    if ((iVar2 != 0) || (*dst < uVar3)) {
      *dst = (ushort)uVar3;
      compute_ln_into((char *)dst,(char *)"\x01");
    }
    return (char *)dst;
  }
  err_throw(0xca);
}

Assistant:

const char *CVmObjBigNum::cache_ln2(size_t prec)
{
    char *ext;
    int expanded;
    static const unsigned char two[] = { 0x01, 0x00, 0x01, 0x00, 0x00, 0x20 };

    /* round up the precision to minimize recalculations */
    prec = (prec + 7) & ~7;

    /* get the ln2 cache register */
    ext = S_bignum_cache->get_ln2_reg(calc_alloc(prec), &expanded);
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* if we had a cached value with enough precision, return it */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* reallocated - set the new precision and recalculate ln2 */
    set_prec(ext, prec);
    compute_ln_into(ext, (const char *)two);

    /* return the register pointer */
    return ext;
}